

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format-inl.h
# Opt level: O1

int __thiscall fmt::v6::system_error::init(system_error *this,EVP_PKEY_CTX *ctx)

{
  string_view message;
  int iVar1;
  int extraout_EAX;
  int extraout_EAX_00;
  size_t in_RCX;
  char *in_RDX;
  unsigned_long_long in_R8;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>_2
  in_R9;
  basic_string_view<char> format_str;
  basic_format_args<fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>_>,_char>_>
  args;
  long *local_480;
  size_t local_478;
  long local_470 [2];
  undefined **local_460;
  undefined1 *local_458;
  long lStack_450;
  ulong local_448;
  undefined1 local_440 [504];
  buffer<char> local_248;
  char local_228 [504];
  
  this->error_code_ = (int)ctx;
  local_248.size_ = 0;
  local_248._vptr_buffer = (_func_int **)&PTR_grow_001ca228;
  local_248.capacity_ = 500;
  lStack_450 = 0;
  local_460 = &PTR_grow_001ca228;
  local_448 = 500;
  format_str.size_ = in_RCX;
  format_str.data_ = in_RDX;
  args.field_1.args_ = in_R9.args_;
  args.types_ = in_R8;
  local_458 = local_440;
  local_248.ptr_ = local_228;
  vformat_to<fmt::v6::arg_formatter<fmt::v6::buffer_range<char>>,char,fmt::v6::basic_format_context<std::back_insert_iterator<fmt::v6::internal::buffer<char>>,char>>
            ((range)&local_460,format_str,args,(locale_ref)0x0);
  local_480 = local_470;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_480,local_458,local_458 + lStack_450);
  local_460 = &PTR_grow_001ca228;
  if (local_458 != local_440) {
    operator_delete(local_458,local_448);
  }
  message.size_ = local_478;
  message.data_ = (char *)local_480;
  format_system_error(&local_248,(int)ctx,message);
  if (local_480 != local_470) {
    operator_delete(local_480,local_470[0] + 1);
  }
  local_460 = (undefined **)&lStack_450;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_460,local_248.ptr_,local_248.ptr_ + local_248.size_);
  std::runtime_error::runtime_error((runtime_error *)&local_480,(string *)&local_460);
  std::runtime_error::operator=(&this->super_runtime_error,(runtime_error *)&local_480);
  iVar1 = std::runtime_error::~runtime_error((runtime_error *)&local_480);
  if (local_460 != (undefined **)&lStack_450) {
    operator_delete(local_460,lStack_450 + 1);
    iVar1 = extraout_EAX;
  }
  local_248._vptr_buffer = (_func_int **)&PTR_grow_001ca228;
  if (local_248.ptr_ != local_228) {
    operator_delete(local_248.ptr_,local_248.capacity_);
    iVar1 = extraout_EAX_00;
  }
  return iVar1;
}

Assistant:

FMT_FUNC void system_error::init(int err_code, string_view format_str,
                                 format_args args) {
  error_code_ = err_code;
  memory_buffer buffer;
  format_system_error(buffer, err_code, vformat(format_str, args));
  std::runtime_error& base = *this;
  base = std::runtime_error(to_string(buffer));
}